

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

void on_connect_without_close(uv_connect_t *req,int status)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (status == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return;
    }
    pcVar1 = "close_cb_calls == 0";
    uStack_10 = 0x54;
  }
  else {
    pcVar1 = "status == UV_ECONNREFUSED";
    uStack_10 = 0x4f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void on_connect_without_close(uv_connect_t *req, int status) {
  ASSERT(status == UV_ECONNREFUSED);
  connect_cb_calls++;

  uv_timer_start(&timer, timer_cb, 100, 0);

  ASSERT(close_cb_calls == 0);
}